

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
* GatherSamplers(unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                 *__return_storage_ptr__,Animation *anim)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  pointer pCVar5;
  uint node_index;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pCVar5 = (anim->channels).
           super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((anim->channels).
      super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar5) {
    uVar2 = 0;
    uVar4 = 1;
    uStack_38 = in_RAX;
    do {
      if (pCVar5[uVar2].sampler <
          (int)((ulong)((long)(anim->samplers).
                              super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(anim->samplers).
                             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
        pCVar5 = pCVar5 + uVar2;
        uStack_38 = CONCAT44((pCVar5->target).node.index,(undefined4)uStack_38);
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)__return_storage_ptr__,(key_type *)((long)&uStack_38 + 4));
        switch((pCVar5->target).path) {
        case AnimationPath_TRANSLATION:
          pmVar3->translation =
               (anim->samplers).
               super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar5->sampler;
          break;
        case AnimationPath_ROTATION:
          pmVar3->rotation =
               (anim->samplers).
               super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar5->sampler;
          break;
        case AnimationPath_SCALE:
          pmVar3->scale =
               (anim->samplers).
               super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar5->sampler;
          break;
        case AnimationPath_WEIGHTS:
          pmVar3->weight =
               (anim->samplers).
               super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar5->sampler;
        }
      }
      pCVar5 = (anim->channels).
               super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar4 < (ulong)((long)(anim->channels).
                                    super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 5);
      uVar2 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<unsigned int, AnimationSamplers> GatherSamplers(Animation& anim)
{
    std::unordered_map<unsigned int, AnimationSamplers> samplers;
    for (unsigned int c = 0; c < anim.channels.size(); ++c) {
        Animation::Channel& channel = anim.channels[c];
        if (channel.sampler >= static_cast<int>(anim.samplers.size())) {
            continue;
        }

        const unsigned int node_index = channel.target.node.GetIndex();

        AnimationSamplers& sampler = samplers[node_index];
        if (channel.target.path == AnimationPath_TRANSLATION) {
            sampler.translation = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_ROTATION) {
            sampler.rotation = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_SCALE) {
            sampler.scale = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_WEIGHTS) {
            sampler.weight = &anim.samplers[channel.sampler];
        }
    }

    return samplers;
}